

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O3

int Abc_NodeMinimumBase(Abc_Obj_t *pNode)

{
  DdNode *bF;
  int iVar1;
  int iVar2;
  Vec_Str_t *vSupport;
  char *pcVar3;
  Vec_Ptr_t *vNodes;
  void **ppvVar4;
  DdNode *n;
  int iVar5;
  long lVar6;
  
  if ((pNode->pNtk->ntkFunc != ABC_FUNC_BDD) || (pNode->pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsBddLogic(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x52,"int Abc_NodeMinimumBase(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                  ,0x53,"int Abc_NodeMinimumBase(Abc_Obj_t *)");
  }
  vSupport = (Vec_Str_t *)malloc(0x10);
  vSupport->nCap = 0x10;
  vSupport->nSize = 0;
  pcVar3 = (char *)malloc(0x10);
  vSupport->pArray = pcVar3;
  iVar1 = Abc_NodeSupport((DdNode *)((ulong)(pNode->field_5).pData & 0xfffffffffffffffe),vSupport,
                          (pNode->vFanins).nSize);
  iVar2 = (pNode->vFanins).nSize;
  if (iVar1 == iVar2) {
    pcVar3 = vSupport->pArray;
    iVar2 = 0;
  }
  else {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    iVar5 = 8;
    if (6 < iVar2 - 1U) {
      iVar5 = iVar2;
    }
    vNodes->nSize = 0;
    vNodes->nCap = iVar5;
    if (iVar5 == 0) {
      ppvVar4 = (void **)0x0;
    }
    else {
      ppvVar4 = (void **)malloc((long)iVar5 << 3);
    }
    vNodes->pArray = ppvVar4;
    Abc_NodeCollectFanins(pNode,vNodes);
    iVar2 = vNodes->nSize;
    if (0 < iVar2) {
      lVar6 = 0;
      do {
        if (vSupport->pArray[lVar6] == '\0') {
          Abc_ObjDeleteFanin(pNode,(Abc_Obj_t *)vNodes->pArray[lVar6]);
          iVar2 = vNodes->nSize;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar2);
    }
    if (iVar1 != (pNode->vFanins).nSize) {
      __assert_fail("nVars == Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcMinBase.c"
                    ,100,"int Abc_NodeMinimumBase(Abc_Obj_t *)");
    }
    bF = (DdNode *)(pNode->field_5).pData;
    n = Extra_bddRemapUp((DdManager *)pNode->pNtk->pManFunc,bF);
    (pNode->field_5).pData = n;
    Cudd_Ref(n);
    Cudd_RecursiveDeref((DdManager *)pNode->pNtk->pManFunc,bF);
    if (vNodes->pArray != (void **)0x0) {
      free(vNodes->pArray);
    }
    free(vNodes);
    pcVar3 = vSupport->pArray;
    iVar2 = 1;
  }
  if (pcVar3 != (char *)0x0) {
    free(pcVar3);
  }
  free(vSupport);
  return iVar2;
}

Assistant:

int Abc_NodeMinimumBase( Abc_Obj_t * pNode )
{
    Vec_Str_t * vSupport;
    Vec_Ptr_t * vFanins;
    DdNode * bTemp;
    int i, nVars;

    assert( Abc_NtkIsBddLogic(pNode->pNtk) );
    assert( Abc_ObjIsNode(pNode) );

    // compute support
    vSupport = Vec_StrAlloc( 10 );
    nVars = Abc_NodeSupport( Cudd_Regular(pNode->pData), vSupport, Abc_ObjFaninNum(pNode) );
    if ( nVars == Abc_ObjFaninNum(pNode) )
    {
        Vec_StrFree( vSupport );
        return 0;
    }

    // remove unused fanins
    vFanins = Vec_PtrAlloc( Abc_ObjFaninNum(pNode) );
    Abc_NodeCollectFanins( pNode, vFanins );
    for ( i = 0; i < vFanins->nSize; i++ )
        if ( vSupport->pArray[i] == 0 )
            Abc_ObjDeleteFanin( pNode, (Abc_Obj_t *)vFanins->pArray[i] );
    assert( nVars == Abc_ObjFaninNum(pNode) );

    // update the function of the node
    pNode->pData = Extra_bddRemapUp( (DdManager *)pNode->pNtk->pManFunc, bTemp = (DdNode *)pNode->pData );   Cudd_Ref( (DdNode *)pNode->pData );
    Cudd_RecursiveDeref( (DdManager *)pNode->pNtk->pManFunc, bTemp );
    Vec_PtrFree( vFanins );
    Vec_StrFree( vSupport );
    return 1;
}